

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  uint uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [32];
  uint uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar39;
  float fVar40;
  undefined1 auVar28 [16];
  float fVar41;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar59;
  float fVar83;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar90;
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar81;
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 in_ZMM2 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar75 [32];
  undefined1 auVar80 [32];
  
  uVar1 = bottom_top_blob->c;
  uVar22 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    uVar16 = 0;
    if ((int)uVar22 < 1) {
      uVar22 = 0;
    }
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    auVar116._8_4_ = 0x42b0c0a5;
    auVar116._0_8_ = 0x42b0c0a542b0c0a5;
    auVar116._12_4_ = 0x42b0c0a5;
    auVar116._16_4_ = 0x42b0c0a5;
    auVar116._20_4_ = 0x42b0c0a5;
    auVar116._24_4_ = 0x42b0c0a5;
    auVar116._28_4_ = 0x42b0c0a5;
    auVar118._8_4_ = 0xc2b0c0a5;
    auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar118._12_4_ = 0xc2b0c0a5;
    auVar118._16_4_ = 0xc2b0c0a5;
    auVar118._20_4_ = 0xc2b0c0a5;
    auVar118._24_4_ = 0xc2b0c0a5;
    auVar118._28_4_ = 0xc2b0c0a5;
    auVar105._8_4_ = 0x3f000000;
    auVar105._0_8_ = 0x3f0000003f000000;
    auVar105._12_4_ = 0x3f000000;
    auVar105._16_4_ = 0x3f000000;
    auVar105._20_4_ = 0x3f000000;
    auVar105._24_4_ = 0x3f000000;
    auVar105._28_4_ = 0x3f000000;
    auVar104._8_4_ = 0x3f800000;
    auVar104._0_8_ = 0x3f8000003f800000;
    auVar104._12_4_ = 0x3f800000;
    auVar104._16_4_ = 0x3f800000;
    auVar104._20_4_ = 0x3f800000;
    auVar104._24_4_ = 0x3f800000;
    auVar104._28_4_ = 0x3f800000;
    for (; uVar16 != uVar1; uVar16 = uVar16 + 1) {
      pauVar21 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar16 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar19 = uVar22;
      while (bVar26 = uVar19 != 0, uVar19 = uVar19 - 1, bVar26) {
        auVar7 = *pauVar21;
        auVar5 = vminps_avx(auVar116,auVar7);
        auVar35 = vmaxps_avx(auVar118,auVar5);
        auVar127._0_4_ = auVar35._0_4_ * 1.442695 + 0.5;
        auVar127._4_4_ = auVar35._4_4_ * 1.442695 + 0.5;
        auVar127._8_4_ = auVar35._8_4_ * 1.442695 + 0.5;
        auVar127._12_4_ = auVar35._12_4_ * 1.442695 + 0.5;
        auVar127._16_4_ = auVar35._16_4_ * 1.442695 + 0.5;
        auVar127._20_4_ = auVar35._20_4_ * 1.442695 + 0.5;
        auVar127._24_4_ = auVar35._24_4_ * 1.442695 + 0.5;
        auVar127._28_4_ = in_ZMM13._28_4_ + 0.5;
        auVar53 = vroundps_avx(auVar127,1);
        auVar5 = vcmpps_avx(auVar127,auVar53,1);
        auVar5 = vandps_avx(auVar5,auVar104);
        auVar53 = vsubps_avx(auVar53,auVar5);
        auVar6._4_4_ = auVar53._4_4_ * 0.6931472;
        auVar6._0_4_ = auVar53._0_4_ * 0.6931472;
        auVar6._8_4_ = auVar53._8_4_ * 0.6931472;
        auVar6._12_4_ = auVar53._12_4_ * 0.6931472;
        auVar6._16_4_ = auVar53._16_4_ * 0.6931472;
        auVar6._20_4_ = auVar53._20_4_ * 0.6931472;
        auVar6._24_4_ = auVar53._24_4_ * 0.6931472;
        auVar6._28_4_ = auVar5._28_4_;
        auVar5 = vsubps_avx(auVar35,auVar6);
        fVar27 = auVar5._0_4_;
        fVar39 = auVar5._4_4_;
        fVar40 = auVar5._8_4_;
        fVar41 = auVar5._12_4_;
        fVar84 = auVar5._16_4_;
        fVar86 = auVar5._20_4_;
        fVar88 = auVar5._24_4_;
        auVar64._0_4_ = (int)auVar53._0_4_;
        auVar64._4_4_ = (int)auVar53._4_4_;
        auVar64._8_4_ = (int)auVar53._8_4_;
        auVar64._12_4_ = (int)auVar53._12_4_;
        auVar52._16_4_ = (int)auVar53._16_4_;
        auVar52._0_16_ = auVar64;
        auVar52._20_4_ = (int)auVar53._20_4_;
        auVar52._24_4_ = (int)auVar53._24_4_;
        auVar52._28_4_ = (int)auVar53._28_4_;
        auVar123 = vpslld_avx(auVar64,0x17);
        auVar64 = vpslld_avx(auVar52._16_16_,0x17);
        auVar124._8_4_ = 0x3f800000;
        auVar124._0_8_ = 0x3f8000003f800000;
        auVar124._12_4_ = 0x3f800000;
        auVar64 = vpaddd_avx(auVar64,auVar124);
        auVar123 = vpaddd_avx(auVar123,auVar124);
        auVar128._0_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar123._0_4_ + 1.0;
        auVar128._4_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar123._4_4_ + 1.0;
        auVar128._8_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar123._8_4_ + 1.0;
        auVar128._12_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar123._12_4_ + 1.0;
        auVar128._16_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar64._0_4_ + 1.0;
        auVar128._20_4_ =
             (fVar86 + 1.0 +
             fVar86 * fVar86 *
             (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
               0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar64._4_4_ + 1.0;
        auVar128._24_4_ =
             (fVar88 + 1.0 +
             fVar88 * fVar88 *
             (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
               0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar64._8_4_ + 1.0;
        auVar128._28_4_ =
             auVar5._28_4_ + 1.0 +
             in_ZMM2._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 1.0;
        in_ZMM13 = ZEXT3264(auVar128);
        auVar35._8_4_ = 0x800000;
        auVar35._0_8_ = 0x80000000800000;
        auVar35._12_4_ = 0x800000;
        auVar35._16_4_ = 0x800000;
        auVar35._20_4_ = 0x800000;
        auVar35._24_4_ = 0x800000;
        auVar35._28_4_ = 0x800000;
        auVar53 = vmaxps_avx(auVar128,auVar35);
        auVar64 = vpsrld_avx(auVar53._16_16_,0x17);
        auVar36._8_4_ = 0x807fffff;
        auVar36._0_8_ = 0x807fffff807fffff;
        auVar36._12_4_ = 0x807fffff;
        auVar36._16_4_ = 0x807fffff;
        auVar36._20_4_ = 0x807fffff;
        auVar36._24_4_ = 0x807fffff;
        auVar36._28_4_ = 0x807fffff;
        auVar5 = vandps_avx(auVar53,auVar36);
        auVar6 = vorps_avx(auVar5,auVar105);
        auVar111._8_4_ = 0x3f3504f3;
        auVar111._0_8_ = 0x3f3504f33f3504f3;
        auVar111._12_4_ = 0x3f3504f3;
        auVar111._16_4_ = 0x3f3504f3;
        auVar111._20_4_ = 0x3f3504f3;
        auVar111._24_4_ = 0x3f3504f3;
        auVar111._28_4_ = 0x3f3504f3;
        auVar35 = vcmpps_avx(auVar111,auVar6,2);
        auVar5 = vandnps_avx(auVar35,auVar6);
        fVar27 = auVar5._0_4_ + auVar6._0_4_ + -1.0;
        fVar39 = auVar5._4_4_ + auVar6._4_4_ + -1.0;
        fVar40 = auVar5._8_4_ + auVar6._8_4_ + -1.0;
        fVar41 = auVar5._12_4_ + auVar6._12_4_ + -1.0;
        fVar84 = auVar5._16_4_ + auVar6._16_4_ + -1.0;
        fVar86 = auVar5._20_4_ + auVar6._20_4_ + -1.0;
        fVar88 = auVar5._24_4_ + auVar6._24_4_ + -1.0;
        auVar64 = vpsubd_avx(auVar64,auVar35._16_16_);
        auVar123 = vpsrld_avx(auVar53._0_16_,0x17);
        auVar113._8_4_ = 0xffffff81;
        auVar113._0_8_ = 0xffffff81ffffff81;
        auVar113._12_4_ = 0xffffff81;
        auVar64 = vpaddd_avx(auVar113,auVar64);
        auVar123 = vpsubd_avx(auVar123,auVar35._0_16_);
        auVar123 = vpaddd_avx(auVar113,auVar123);
        auVar53._16_16_ = auVar64;
        auVar53._0_16_ = auVar123;
        auVar35 = vcmpps_avx(auVar128,_DAT_004c35e0,2);
        auVar53 = vcvtdq2ps_avx(auVar53);
        auVar8._4_4_ = (auVar53._4_4_ * 0.6931472 + fVar39 +
                       fVar39 * fVar39 *
                       (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39
                             + -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39
                          + 0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 +
                       -0.5)) * -2.0;
        auVar8._0_4_ = (auVar53._0_4_ * 0.6931472 + fVar27 +
                       fVar27 * fVar27 *
                       (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27
                             + -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27
                          + 0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 +
                       -0.5)) * -2.0;
        auVar8._8_4_ = (auVar53._8_4_ * 0.6931472 + fVar40 +
                       fVar40 * fVar40 *
                       (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40
                             + -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40
                          + 0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 +
                       -0.5)) * -2.0;
        auVar8._12_4_ =
             (auVar53._12_4_ * 0.6931472 + fVar41 +
             fVar41 * fVar41 *
             (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                   -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714
                ) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5)) * -2.0;
        auVar8._16_4_ =
             (auVar53._16_4_ * 0.6931472 + fVar84 +
             fVar84 * fVar84 *
             (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 + 0.116769984) * fVar84 +
                   -0.12420141) * fVar84 + 0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714
                ) * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5)) * -2.0;
        auVar8._20_4_ =
             (auVar53._20_4_ * 0.6931472 + fVar86 +
             fVar86 * fVar86 *
             (((((((((fVar86 * 0.070376836 + -0.1151461) * fVar86 + 0.116769984) * fVar86 +
                   -0.12420141) * fVar86 + 0.14249323) * fVar86 + -0.16668057) * fVar86 + 0.20000714
                ) * fVar86 + -0.24999994) * fVar86 + 0.3333333) * fVar86 + -0.5)) * -2.0;
        auVar8._24_4_ =
             (auVar53._24_4_ * 0.6931472 + fVar88 +
             fVar88 * fVar88 *
             (((((((((fVar88 * 0.070376836 + -0.1151461) * fVar88 + 0.116769984) * fVar88 +
                   -0.12420141) * fVar88 + 0.14249323) * fVar88 + -0.16668057) * fVar88 + 0.20000714
                ) * fVar88 + -0.24999994) * fVar88 + 0.3333333) * fVar88 + -0.5)) * -2.0;
        auVar8._28_4_ = auVar53._28_4_ + auVar5._28_4_ + auVar6._28_4_ + -1.0 + 0.0;
        auVar54._8_4_ = 0x7fffffff;
        auVar54._0_8_ = 0x7fffffff7fffffff;
        auVar54._12_4_ = 0x7fffffff;
        auVar54._16_4_ = 0x7fffffff;
        auVar54._20_4_ = 0x7fffffff;
        auVar54._24_4_ = 0x7fffffff;
        auVar54._28_4_ = 0x7fffffff;
        auVar5 = vblendvps_avx(auVar8,auVar54,auVar35);
        auVar5 = vminps_avx(auVar116,auVar5);
        auVar35 = vmaxps_avx(auVar118,auVar5);
        auVar55._0_4_ = auVar35._0_4_ * 1.442695 + 0.5;
        auVar55._4_4_ = auVar35._4_4_ * 1.442695 + 0.5;
        auVar55._8_4_ = auVar35._8_4_ * 1.442695 + 0.5;
        auVar55._12_4_ = auVar35._12_4_ * 1.442695 + 0.5;
        auVar55._16_4_ = auVar35._16_4_ * 1.442695 + 0.5;
        auVar55._20_4_ = auVar35._20_4_ * 1.442695 + 0.5;
        auVar55._24_4_ = auVar35._24_4_ * 1.442695 + 0.5;
        auVar55._28_4_ = 0x7fc00000;
        auVar53 = vroundps_avx(auVar55,1);
        auVar5 = vcmpps_avx(auVar55,auVar53,1);
        auVar5 = vandps_avx(auVar5,auVar104);
        auVar5 = vsubps_avx(auVar53,auVar5);
        auVar9._4_4_ = auVar5._4_4_ * 0.6931472;
        auVar9._0_4_ = auVar5._0_4_ * 0.6931472;
        auVar9._8_4_ = auVar5._8_4_ * 0.6931472;
        auVar9._12_4_ = auVar5._12_4_ * 0.6931472;
        auVar9._16_4_ = auVar5._16_4_ * 0.6931472;
        auVar9._20_4_ = auVar5._20_4_ * 0.6931472;
        auVar9._24_4_ = auVar5._24_4_ * 0.6931472;
        auVar9._28_4_ = auVar53._28_4_;
        auVar35 = vsubps_avx(auVar35,auVar9);
        fVar27 = auVar35._0_4_;
        fVar39 = auVar35._4_4_;
        fVar40 = auVar35._8_4_;
        fVar41 = auVar35._12_4_;
        fVar84 = auVar35._16_4_;
        fVar86 = auVar35._20_4_;
        fVar88 = auVar35._24_4_;
        auVar123._0_4_ = (int)auVar5._0_4_;
        auVar123._4_4_ = (int)auVar5._4_4_;
        auVar123._8_4_ = (int)auVar5._8_4_;
        auVar123._12_4_ = (int)auVar5._12_4_;
        auVar56._16_4_ = (int)auVar5._16_4_;
        auVar56._0_16_ = auVar123;
        auVar56._20_4_ = (int)auVar5._20_4_;
        auVar56._24_4_ = (int)auVar5._24_4_;
        auVar56._28_4_ = (int)auVar5._28_4_;
        auVar123 = vpslld_avx(auVar123,0x17);
        auVar64 = vpslld_avx(auVar56._16_16_,0x17);
        auVar64 = vpaddd_avx(auVar64,auVar124);
        auVar123 = vpaddd_avx(auVar123,auVar124);
        auVar37._0_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar123._0_4_ + 1.0;
        auVar37._4_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar123._4_4_ + 1.0;
        auVar37._8_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar123._8_4_ + 1.0;
        auVar37._12_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar123._12_4_ + 1.0;
        auVar37._16_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar64._0_4_ + 1.0;
        auVar37._20_4_ =
             (fVar86 + 1.0 +
             fVar86 * fVar86 *
             (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
               0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar64._4_4_ + 1.0;
        auVar37._24_4_ =
             (fVar88 + 1.0 +
             fVar88 * fVar88 *
             (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
               0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar64._8_4_ + 1.0;
        auVar37._28_4_ = auVar35._28_4_ + 1.0 + auVar53._28_4_ + 1.0;
        auVar5 = vrcpps_avx(auVar37);
        fVar27 = auVar5._0_4_;
        fVar59 = fVar27 + fVar27;
        fVar39 = auVar5._4_4_;
        fVar81 = fVar39 + fVar39;
        fVar40 = auVar5._8_4_;
        fVar82 = fVar40 + fVar40;
        fVar41 = auVar5._12_4_;
        fVar83 = fVar41 + fVar41;
        fVar84 = auVar5._16_4_;
        fVar85 = fVar84 + fVar84;
        fVar86 = auVar5._20_4_;
        fVar87 = fVar86 + fVar86;
        fVar88 = auVar5._24_4_;
        fVar89 = fVar88 + fVar88;
        fVar90 = auVar5._28_4_ + auVar5._28_4_;
        in_ZMM2 = ZEXT3264(CONCAT428(fVar90,CONCAT424(fVar89,CONCAT420(fVar87,CONCAT416(fVar85,
                                                  CONCAT412(fVar83,CONCAT48(fVar82,CONCAT44(fVar81,
                                                  fVar59))))))));
        auVar5._4_4_ = auVar37._4_4_ * fVar81;
        auVar5._0_4_ = auVar37._0_4_ * fVar59;
        auVar5._8_4_ = auVar37._8_4_ * fVar82;
        auVar5._12_4_ = auVar37._12_4_ * fVar83;
        auVar5._16_4_ = auVar37._16_4_ * fVar85;
        auVar5._20_4_ = auVar37._20_4_ * fVar87;
        auVar5._24_4_ = auVar37._24_4_ * fVar89;
        auVar5._28_4_ = auVar37._28_4_;
        auVar96._8_4_ = 0x40000000;
        auVar96._0_8_ = 0x4000000040000000;
        auVar96._12_4_ = 0x40000000;
        auVar96._16_4_ = 0x40000000;
        auVar96._20_4_ = 0x40000000;
        auVar96._24_4_ = 0x40000000;
        auVar96._28_4_ = 0x40000000;
        auVar5 = vsubps_avx(auVar96,auVar5);
        local_58 = auVar7._0_4_;
        fStack_54 = auVar7._4_4_;
        fStack_50 = auVar7._8_4_;
        fStack_4c = auVar7._12_4_;
        fStack_48 = auVar7._16_4_;
        fStack_44 = auVar7._20_4_;
        fStack_40 = auVar7._24_4_;
        auVar7._4_4_ = (fVar81 + -1.0 + fVar39 * auVar5._4_4_) * fStack_54;
        auVar7._0_4_ = (fVar59 + -1.0 + fVar27 * auVar5._0_4_) * local_58;
        auVar7._8_4_ = (fVar82 + -1.0 + fVar40 * auVar5._8_4_) * fStack_50;
        auVar7._12_4_ = (fVar83 + -1.0 + fVar41 * auVar5._12_4_) * fStack_4c;
        auVar7._16_4_ = (fVar85 + -1.0 + fVar84 * auVar5._16_4_) * fStack_48;
        auVar7._20_4_ = (fVar87 + -1.0 + fVar86 * auVar5._20_4_) * fStack_44;
        auVar7._24_4_ = (fVar89 + -1.0 + fVar88 * auVar5._24_4_) * fStack_40;
        auVar7._28_4_ = fVar90 + -1.0 + auVar5._28_4_;
        *pauVar21 = auVar7;
        pauVar21 = pauVar21 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    uVar15 = 0;
    uVar16 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar16 = uVar15;
    }
    uVar25 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar25 = uVar15;
    }
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar109._8_4_ = 0xc2b0c0a5;
    auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar109._12_4_ = 0xc2b0c0a5;
    for (; uVar15 != uVar25; uVar15 = uVar15 + 1) {
      pauVar18 = (undefined1 (*) [16])
                 (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar20 = uVar16;
      while (iVar23 = (int)uVar20, uVar20 = (ulong)(iVar23 - 1), iVar23 != 0) {
        auVar64 = *pauVar18;
        auVar60._8_4_ = 0x42b0c0a5;
        auVar60._0_8_ = 0x42b0c0a542b0c0a5;
        auVar60._12_4_ = 0x42b0c0a5;
        auVar123 = vminps_avx(auVar64,auVar60);
        auVar113 = vmaxps_avx(auVar123,auVar109);
        auVar61._8_4_ = 0x3f000000;
        auVar61._0_8_ = 0x3f0000003f000000;
        auVar61._12_4_ = 0x3f000000;
        auVar130._0_4_ = auVar113._0_4_ * 1.442695 + 0.5;
        auVar130._4_4_ = auVar113._4_4_ * 1.442695 + 0.5;
        auVar130._8_4_ = auVar113._8_4_ * 1.442695 + 0.5;
        auVar130._12_4_ = auVar113._12_4_ * 1.442695 + 0.5;
        auVar121._0_4_ = (int)auVar130._0_4_;
        auVar121._4_4_ = (int)auVar130._4_4_;
        auVar121._8_4_ = (int)auVar130._8_4_;
        auVar121._12_4_ = (int)auVar130._12_4_;
        auVar124 = vcvtdq2ps_avx(auVar121);
        auVar123 = vcmpps_avx(auVar130,auVar124,1);
        auVar123 = vandps_avx(auVar123,auVar99);
        auVar123 = vsubps_avx(auVar124,auVar123);
        auVar131._0_4_ = auVar123._0_4_ * 0.6931472;
        auVar131._4_4_ = auVar123._4_4_ * 0.6931472;
        auVar131._8_4_ = auVar123._8_4_ * 0.6931472;
        auVar131._12_4_ = auVar123._12_4_ * 0.6931472;
        auVar124 = vsubps_avx(auVar113,auVar131);
        fVar27 = auVar124._0_4_;
        fVar39 = auVar124._4_4_;
        fVar40 = auVar124._8_4_;
        fVar41 = auVar124._12_4_;
        auVar122._0_4_ = (int)auVar123._0_4_;
        auVar122._4_4_ = (int)auVar123._4_4_;
        auVar122._8_4_ = (int)auVar123._8_4_;
        auVar122._12_4_ = (int)auVar123._12_4_;
        auVar123 = vpslld_avx(auVar122,0x17);
        auVar123 = vpaddd_avx(auVar123,auVar99);
        auVar129._0_4_ =
             auVar123._0_4_ *
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (fVar27 * (fVar27 * (fVar27 * (fVar27 * (fVar27 * 0.00019875691 + 0.0013981999) +
                                           0.008333452) + 0.041665796) + 0.16666666) + 0.5)) + 1.0;
        auVar129._4_4_ =
             auVar123._4_4_ *
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (fVar39 * (fVar39 * (fVar39 * (fVar39 * (fVar39 * 0.00019875691 + 0.0013981999) +
                                           0.008333452) + 0.041665796) + 0.16666666) + 0.5)) + 1.0;
        auVar129._8_4_ =
             auVar123._8_4_ *
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (fVar40 * (fVar40 * (fVar40 * (fVar40 * (fVar40 * 0.00019875691 + 0.0013981999) +
                                           0.008333452) + 0.041665796) + 0.16666666) + 0.5)) + 1.0;
        auVar129._12_4_ =
             auVar123._12_4_ *
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (fVar41 * (fVar41 * (fVar41 * (fVar41 * (fVar41 * 0.00019875691 + 0.0013981999) +
                                           0.008333452) + 0.041665796) + 0.16666666) + 0.5)) + 1.0;
        auVar28._8_4_ = 0x800000;
        auVar28._0_8_ = 0x80000000800000;
        auVar28._12_4_ = 0x800000;
        auVar123 = vmaxps_avx(auVar129,auVar28);
        auVar124 = vpsrld_avx(auVar123,0x17);
        auVar42._8_4_ = 0xffffff82;
        auVar42._0_8_ = 0xffffff82ffffff82;
        auVar42._12_4_ = 0xffffff82;
        auVar124 = vpaddd_avx(auVar124,auVar42);
        auVar43._8_4_ = 0x807fffff;
        auVar43._0_8_ = 0x807fffff807fffff;
        auVar43._12_4_ = 0x807fffff;
        auVar123 = vandps_avx(auVar123,auVar43);
        auVar33 = vorps_avx(auVar123,auVar61);
        auVar113 = vcvtdq2ps_avx(auVar124);
        auVar44._8_4_ = 0x3f3504f3;
        auVar44._0_8_ = 0x3f3504f33f3504f3;
        auVar44._12_4_ = 0x3f3504f3;
        auVar124 = vcmpps_avx(auVar33,auVar44,1);
        auVar123 = vandps_avx(auVar124,auVar33);
        fVar27 = auVar33._0_4_ + -1.0 + auVar123._0_4_;
        fVar39 = auVar33._4_4_ + -1.0 + auVar123._4_4_;
        fVar40 = auVar33._8_4_ + -1.0 + auVar123._8_4_;
        fVar41 = auVar33._12_4_ + -1.0 + auVar123._12_4_;
        auVar123 = vandps_avx(auVar124,auVar99);
        auVar124 = vsubps_avx(auVar113,auVar123);
        auVar123 = vcmpps_avx(auVar129,_DAT_004bf890,2);
        auVar29._0_4_ =
             (fVar27 * fVar27 *
              (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                    -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 +
                 0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5) +
             auVar124._0_4_ * 0.6931472 + fVar27) * -2.0;
        auVar29._4_4_ =
             (fVar39 * fVar39 *
              (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                    -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 +
                 0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5) +
             auVar124._4_4_ * 0.6931472 + fVar39) * -2.0;
        auVar29._8_4_ =
             (fVar40 * fVar40 *
              (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                    -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 +
                 0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5) +
             auVar124._8_4_ * 0.6931472 + fVar40) * -2.0;
        auVar29._12_4_ =
             (fVar41 * fVar41 *
              (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                    -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 +
                 0.20000714) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5) +
             auVar124._12_4_ * 0.6931472 + fVar41) * -2.0;
        auVar45._8_4_ = 0x7fffffff;
        auVar45._0_8_ = 0x7fffffff7fffffff;
        auVar45._12_4_ = 0x7fffffff;
        auVar123 = vblendvps_avx(auVar29,auVar45,auVar123);
        auVar46._8_4_ = 0x42b0c0a5;
        auVar46._0_8_ = 0x42b0c0a542b0c0a5;
        auVar46._12_4_ = 0x42b0c0a5;
        auVar123 = vminps_avx(auVar123,auVar46);
        auVar113 = vmaxps_avx(auVar123,auVar109);
        auVar47._0_4_ = auVar113._0_4_ * 1.442695 + 0.5;
        auVar47._4_4_ = auVar113._4_4_ * 1.442695 + 0.5;
        auVar47._8_4_ = auVar113._8_4_ * 1.442695 + 0.5;
        auVar47._12_4_ = auVar113._12_4_ * 1.442695 + 0.5;
        auVar125._0_4_ = (int)auVar47._0_4_;
        auVar125._4_4_ = (int)auVar47._4_4_;
        auVar125._8_4_ = (int)auVar47._8_4_;
        auVar125._12_4_ = (int)auVar47._12_4_;
        auVar124 = vcvtdq2ps_avx(auVar125);
        auVar123 = vcmpps_avx(auVar47,auVar124,1);
        auVar123 = vandps_avx(auVar123,auVar99);
        auVar123 = vsubps_avx(auVar124,auVar123);
        auVar126._0_4_ = auVar123._0_4_ * 0.6931472;
        auVar126._4_4_ = auVar123._4_4_ * 0.6931472;
        auVar126._8_4_ = auVar123._8_4_ * 0.6931472;
        auVar126._12_4_ = auVar123._12_4_ * 0.6931472;
        auVar124 = vsubps_avx(auVar113,auVar126);
        fVar27 = auVar124._0_4_;
        fVar39 = auVar124._4_4_;
        fVar40 = auVar124._8_4_;
        fVar41 = auVar124._12_4_;
        auVar48._0_4_ = (int)auVar123._0_4_;
        auVar48._4_4_ = (int)auVar123._4_4_;
        auVar48._8_4_ = (int)auVar123._8_4_;
        auVar48._12_4_ = (int)auVar123._12_4_;
        auVar123 = vpslld_avx(auVar48,0x17);
        auVar123 = vpaddd_avx(auVar123,auVar99);
        auVar30._0_4_ =
             (fVar27 * fVar27 *
              (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) + fVar27 + 1.0) * auVar123._0_4_
             + 1.0;
        auVar30._4_4_ =
             (fVar39 * fVar39 *
              (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5) + fVar39 + 1.0) * auVar123._4_4_
             + 1.0;
        auVar30._8_4_ =
             (fVar40 * fVar40 *
              (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5) + fVar40 + 1.0) * auVar123._8_4_
             + 1.0;
        auVar30._12_4_ =
             (fVar41 * fVar41 *
              (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) + fVar41 + 1.0) *
             auVar123._12_4_ + 1.0;
        auVar123 = vrcpps_avx(auVar30);
        fVar27 = auVar123._0_4_;
        fVar39 = auVar123._4_4_;
        fVar40 = auVar123._8_4_;
        fVar41 = auVar123._12_4_;
        auVar31._0_4_ = (fVar27 + fVar27) * auVar30._0_4_;
        auVar31._4_4_ = (fVar39 + fVar39) * auVar30._4_4_;
        auVar31._8_4_ = (fVar40 + fVar40) * auVar30._8_4_;
        auVar31._12_4_ = (fVar41 + fVar41) * auVar30._12_4_;
        auVar62._8_4_ = 0x40000000;
        auVar62._0_8_ = 0x4000000040000000;
        auVar62._12_4_ = 0x40000000;
        auVar123 = vsubps_avx(auVar62,auVar31);
        auVar32._0_4_ = auVar64._0_4_ * (fVar27 + fVar27 + -1.0 + fVar27 * auVar123._0_4_);
        auVar32._4_4_ = auVar64._4_4_ * (fVar39 + fVar39 + -1.0 + fVar39 * auVar123._4_4_);
        auVar32._8_4_ = auVar64._8_4_ * (fVar40 + fVar40 + -1.0 + fVar40 * auVar123._8_4_);
        auVar32._12_4_ = auVar64._12_4_ * (fVar41 + fVar41 + -1.0 + fVar41 * auVar123._12_4_);
        *pauVar18 = auVar32;
        pauVar18 = pauVar18 + 1;
      }
    }
  }
  else {
    uVar15 = 0;
    uVar16 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar16 = uVar15;
    }
    for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar21 = (undefined1 (*) [32])(sVar4 * uVar15 * sVar3 + (long)pvVar2);
      lVar24 = 0;
      for (iVar23 = 0; iVar23 + 7 < (int)uVar22; iVar23 = iVar23 + 8) {
        auVar104 = *pauVar21;
        auVar112._8_4_ = 0x42b0c0a5;
        auVar112._0_8_ = 0x42b0c0a542b0c0a5;
        auVar112._12_4_ = 0x42b0c0a5;
        auVar112._16_4_ = 0x42b0c0a5;
        auVar112._20_4_ = 0x42b0c0a5;
        auVar112._24_4_ = 0x42b0c0a5;
        auVar112._28_4_ = 0x42b0c0a5;
        auVar105 = vminps_avx(auVar104,auVar112);
        auVar115._8_4_ = 0xc2b0c0a5;
        auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar115._12_4_ = 0xc2b0c0a5;
        auVar115._16_4_ = 0xc2b0c0a5;
        auVar115._20_4_ = 0xc2b0c0a5;
        auVar115._24_4_ = 0xc2b0c0a5;
        auVar115._28_4_ = 0xc2b0c0a5;
        auVar116 = vmaxps_avx(auVar115,auVar105);
        auVar119._8_4_ = 0x3f000000;
        auVar119._0_8_ = 0x3f0000003f000000;
        auVar119._12_4_ = 0x3f000000;
        auVar119._16_4_ = 0x3f000000;
        auVar119._20_4_ = 0x3f000000;
        auVar119._24_4_ = 0x3f000000;
        auVar119._28_4_ = 0x3f000000;
        auVar74._0_4_ = auVar116._0_4_ * 1.442695 + 0.5;
        auVar74._4_4_ = auVar116._4_4_ * 1.442695 + 0.5;
        auVar74._8_4_ = auVar116._8_4_ * 1.442695 + 0.5;
        auVar74._12_4_ = auVar116._12_4_ * 1.442695 + 0.5;
        auVar74._16_4_ = auVar116._16_4_ * 1.442695 + 0.5;
        auVar74._20_4_ = auVar116._20_4_ * 1.442695 + 0.5;
        auVar74._24_4_ = auVar116._24_4_ * 1.442695 + 0.5;
        auVar74._28_4_ = in_ZMM2._28_4_ + 0.5;
        auVar118 = vroundps_avx(auVar74,1);
        auVar105 = vcmpps_avx(auVar74,auVar118,1);
        auVar120._8_4_ = 0x3f800000;
        auVar120._0_8_ = 0x3f8000003f800000;
        auVar120._12_4_ = 0x3f800000;
        auVar120._16_4_ = 0x3f800000;
        auVar120._20_4_ = 0x3f800000;
        auVar120._24_4_ = 0x3f800000;
        auVar120._28_4_ = 0x3f800000;
        auVar105 = vandps_avx(auVar120,auVar105);
        auVar105 = vsubps_avx(auVar118,auVar105);
        auVar10._4_4_ = auVar105._4_4_ * 0.6931472;
        auVar10._0_4_ = auVar105._0_4_ * 0.6931472;
        auVar10._8_4_ = auVar105._8_4_ * 0.6931472;
        auVar10._12_4_ = auVar105._12_4_ * 0.6931472;
        auVar10._16_4_ = auVar105._16_4_ * 0.6931472;
        auVar10._20_4_ = auVar105._20_4_ * 0.6931472;
        auVar10._24_4_ = auVar105._24_4_ * 0.6931472;
        auVar10._28_4_ = auVar118._28_4_;
        auVar116 = vsubps_avx(auVar116,auVar10);
        fVar27 = auVar116._0_4_;
        fVar39 = auVar116._4_4_;
        fVar40 = auVar116._8_4_;
        fVar41 = auVar116._12_4_;
        fVar84 = auVar116._16_4_;
        fVar86 = auVar116._20_4_;
        fVar88 = auVar116._24_4_;
        auVar63._0_4_ = (int)auVar105._0_4_;
        auVar63._4_4_ = (int)auVar105._4_4_;
        auVar63._8_4_ = (int)auVar105._8_4_;
        auVar63._12_4_ = (int)auVar105._12_4_;
        auVar75._16_4_ = (int)auVar105._16_4_;
        auVar75._0_16_ = auVar63;
        auVar75._20_4_ = (int)auVar105._20_4_;
        auVar75._24_4_ = (int)auVar105._24_4_;
        auVar75._28_4_ = (int)auVar105._28_4_;
        auVar123 = vpslld_avx(auVar63,0x17);
        auVar64 = vpslld_avx(auVar75._16_16_,0x17);
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar64 = vpaddd_avx(auVar64,auVar33);
        auVar123 = vpaddd_avx(auVar123,auVar33);
        auVar57._0_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar123._0_4_ + 1.0;
        auVar57._4_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar123._4_4_ + 1.0;
        auVar57._8_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar123._8_4_ + 1.0;
        auVar57._12_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar123._12_4_ + 1.0;
        auVar57._16_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar64._0_4_ + 1.0;
        auVar57._20_4_ =
             (fVar86 + 1.0 +
             fVar86 * fVar86 *
             (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
               0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar64._4_4_ + 1.0;
        auVar57._24_4_ =
             (fVar88 + 1.0 +
             fVar88 * fVar88 *
             (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
               0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar64._8_4_ + 1.0;
        auVar57._28_4_ = auVar116._28_4_ + 1.0 + auVar118._28_4_ + 1.0;
        auVar76._8_4_ = 0x800000;
        auVar76._0_8_ = 0x80000000800000;
        auVar76._12_4_ = 0x800000;
        auVar76._16_4_ = 0x800000;
        auVar76._20_4_ = 0x800000;
        auVar76._24_4_ = 0x800000;
        auVar76._28_4_ = 0x800000;
        auVar118 = vmaxps_avx(auVar57,auVar76);
        auVar64 = vpsrld_avx(auVar118._16_16_,0x17);
        auVar77._8_4_ = 0x807fffff;
        auVar77._0_8_ = 0x807fffff807fffff;
        auVar77._12_4_ = 0x807fffff;
        auVar77._16_4_ = 0x807fffff;
        auVar77._20_4_ = 0x807fffff;
        auVar77._24_4_ = 0x807fffff;
        auVar77._28_4_ = 0x807fffff;
        auVar105 = vandps_avx(auVar118,auVar77);
        auVar7 = vorps_avx(auVar119,auVar105);
        auVar106._8_4_ = 0x3f3504f3;
        auVar106._0_8_ = 0x3f3504f33f3504f3;
        auVar106._12_4_ = 0x3f3504f3;
        auVar106._16_4_ = 0x3f3504f3;
        auVar106._20_4_ = 0x3f3504f3;
        auVar106._24_4_ = 0x3f3504f3;
        auVar106._28_4_ = 0x3f3504f3;
        auVar116 = vcmpps_avx(auVar106,auVar7,2);
        auVar105 = vandnps_avx(auVar116,auVar7);
        fVar27 = auVar7._0_4_ + -1.0 + auVar105._0_4_;
        fVar39 = auVar7._4_4_ + -1.0 + auVar105._4_4_;
        fVar40 = auVar7._8_4_ + -1.0 + auVar105._8_4_;
        fVar41 = auVar7._12_4_ + -1.0 + auVar105._12_4_;
        fVar84 = auVar7._16_4_ + -1.0 + auVar105._16_4_;
        fVar86 = auVar7._20_4_ + -1.0 + auVar105._20_4_;
        fVar88 = auVar7._24_4_ + -1.0 + auVar105._24_4_;
        auVar64 = vpsubd_avx(auVar64,auVar116._16_16_);
        auVar123 = vpsrld_avx(auVar118._0_16_,0x17);
        auVar107._8_4_ = 0xffffff81;
        auVar107._0_8_ = 0xffffff81ffffff81;
        auVar107._12_4_ = 0xffffff81;
        auVar64 = vpaddd_avx(auVar64,auVar107);
        auVar123 = vpsubd_avx(auVar123,auVar116._0_16_);
        auVar123 = vpaddd_avx(auVar123,auVar107);
        auVar97._16_16_ = auVar64;
        auVar97._0_16_ = auVar123;
        auVar116 = vcmpps_avx(auVar57,_DAT_004c35e0,2);
        auVar118 = vcvtdq2ps_avx(auVar97);
        auVar11._4_4_ =
             (auVar118._4_4_ * 0.6931472 + fVar39 +
             fVar39 * fVar39 *
             (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                   -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 + 0.20000714
                ) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5)) * -2.0;
        auVar11._0_4_ =
             (auVar118._0_4_ * 0.6931472 + fVar27 +
             fVar27 * fVar27 *
             (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                   -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 + 0.20000714
                ) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5)) * -2.0;
        auVar11._8_4_ =
             (auVar118._8_4_ * 0.6931472 + fVar40 +
             fVar40 * fVar40 *
             (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                   -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 + 0.20000714
                ) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5)) * -2.0;
        auVar11._12_4_ =
             (auVar118._12_4_ * 0.6931472 + fVar41 +
             fVar41 * fVar41 *
             (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                   -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714
                ) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5)) * -2.0;
        auVar11._16_4_ =
             (auVar118._16_4_ * 0.6931472 + fVar84 +
             fVar84 * fVar84 *
             (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 + 0.116769984) * fVar84 +
                   -0.12420141) * fVar84 + 0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714
                ) * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5)) * -2.0;
        auVar11._20_4_ =
             (auVar118._20_4_ * 0.6931472 + fVar86 +
             fVar86 * fVar86 *
             (((((((((fVar86 * 0.070376836 + -0.1151461) * fVar86 + 0.116769984) * fVar86 +
                   -0.12420141) * fVar86 + 0.14249323) * fVar86 + -0.16668057) * fVar86 + 0.20000714
                ) * fVar86 + -0.24999994) * fVar86 + 0.3333333) * fVar86 + -0.5)) * -2.0;
        auVar11._24_4_ =
             (auVar118._24_4_ * 0.6931472 + fVar88 +
             fVar88 * fVar88 *
             (((((((((fVar88 * 0.070376836 + -0.1151461) * fVar88 + 0.116769984) * fVar88 +
                   -0.12420141) * fVar88 + 0.14249323) * fVar88 + -0.16668057) * fVar88 + 0.20000714
                ) * fVar88 + -0.24999994) * fVar88 + 0.3333333) * fVar88 + -0.5)) * -2.0;
        auVar11._28_4_ = auVar118._28_4_ + auVar7._28_4_ + -1.0 + auVar105._28_4_ + 0.0;
        auVar98._8_4_ = 0x7fffffff;
        auVar98._0_8_ = 0x7fffffff7fffffff;
        auVar98._12_4_ = 0x7fffffff;
        auVar98._16_4_ = 0x7fffffff;
        auVar98._20_4_ = 0x7fffffff;
        auVar98._24_4_ = 0x7fffffff;
        auVar98._28_4_ = 0x7fffffff;
        auVar105 = vblendvps_avx(auVar11,auVar98,auVar116);
        auVar78._8_4_ = 0x42b0c0a5;
        auVar78._0_8_ = 0x42b0c0a542b0c0a5;
        auVar78._12_4_ = 0x42b0c0a5;
        auVar78._16_4_ = 0x42b0c0a5;
        auVar78._20_4_ = 0x42b0c0a5;
        auVar78._24_4_ = 0x42b0c0a5;
        auVar78._28_4_ = 0x42b0c0a5;
        auVar105 = vminps_avx(auVar105,auVar78);
        auVar116 = vmaxps_avx(auVar115,auVar105);
        auVar79._0_4_ = auVar116._0_4_ * 1.442695 + 0.5;
        auVar79._4_4_ = auVar116._4_4_ * 1.442695 + 0.5;
        auVar79._8_4_ = auVar116._8_4_ * 1.442695 + 0.5;
        auVar79._12_4_ = auVar116._12_4_ * 1.442695 + 0.5;
        auVar79._16_4_ = auVar116._16_4_ * 1.442695 + 0.5;
        auVar79._20_4_ = auVar116._20_4_ * 1.442695 + 0.5;
        auVar79._24_4_ = auVar116._24_4_ * 1.442695 + 0.5;
        auVar79._28_4_ = 0x42b1c0a5;
        auVar118 = vroundps_avx(auVar79,1);
        auVar105 = vcmpps_avx(auVar79,auVar118,1);
        auVar105 = vandps_avx(auVar120,auVar105);
        auVar105 = vsubps_avx(auVar118,auVar105);
        auVar12._4_4_ = auVar105._4_4_ * 0.6931472;
        auVar12._0_4_ = auVar105._0_4_ * 0.6931472;
        auVar12._8_4_ = auVar105._8_4_ * 0.6931472;
        auVar12._12_4_ = auVar105._12_4_ * 0.6931472;
        auVar12._16_4_ = auVar105._16_4_ * 0.6931472;
        auVar12._20_4_ = auVar105._20_4_ * 0.6931472;
        auVar12._24_4_ = auVar105._24_4_ * 0.6931472;
        auVar12._28_4_ = auVar118._28_4_;
        auVar116 = vsubps_avx(auVar116,auVar12);
        fVar27 = auVar116._0_4_;
        fVar39 = auVar116._4_4_;
        fVar40 = auVar116._8_4_;
        fVar41 = auVar116._12_4_;
        fVar84 = auVar116._16_4_;
        fVar86 = auVar116._20_4_;
        fVar88 = auVar116._24_4_;
        auVar65._0_4_ = (int)auVar105._0_4_;
        auVar65._4_4_ = (int)auVar105._4_4_;
        auVar65._8_4_ = (int)auVar105._8_4_;
        auVar65._12_4_ = (int)auVar105._12_4_;
        auVar80._16_4_ = (int)auVar105._16_4_;
        auVar80._0_16_ = auVar65;
        auVar80._20_4_ = (int)auVar105._20_4_;
        auVar80._24_4_ = (int)auVar105._24_4_;
        auVar80._28_4_ = (int)auVar105._28_4_;
        auVar123 = vpslld_avx(auVar65,0x17);
        auVar64 = vpslld_avx(auVar80._16_16_,0x17);
        auVar64 = vpaddd_avx(auVar64,auVar33);
        auVar123 = vpaddd_avx(auVar123,auVar33);
        auVar58._0_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar123._0_4_ + 1.0;
        auVar58._4_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar123._4_4_ + 1.0;
        auVar58._8_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar123._8_4_ + 1.0;
        auVar58._12_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar123._12_4_ + 1.0;
        auVar58._16_4_ =
             (fVar84 + 1.0 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar64._0_4_ + 1.0;
        auVar58._20_4_ =
             (fVar86 + 1.0 +
             fVar86 * fVar86 *
             (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
               0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar64._4_4_ + 1.0;
        auVar58._24_4_ =
             (fVar88 + 1.0 +
             fVar88 * fVar88 *
             (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
               0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar64._8_4_ + 1.0;
        auVar58._28_4_ = auVar116._28_4_ + 1.0 + auVar118._28_4_ + 1.0;
        auVar105 = vrcpps_avx(auVar58);
        fVar27 = auVar105._0_4_;
        fVar39 = auVar105._4_4_;
        fVar40 = auVar105._8_4_;
        fVar41 = auVar105._12_4_;
        fVar84 = auVar105._16_4_;
        fVar86 = auVar105._20_4_;
        fVar88 = auVar105._24_4_;
        auVar13._4_4_ = auVar58._4_4_ * (fVar39 + fVar39);
        auVar13._0_4_ = auVar58._0_4_ * (fVar27 + fVar27);
        auVar13._8_4_ = auVar58._8_4_ * (fVar40 + fVar40);
        auVar13._12_4_ = auVar58._12_4_ * (fVar41 + fVar41);
        auVar13._16_4_ = auVar58._16_4_ * (fVar84 + fVar84);
        auVar13._20_4_ = auVar58._20_4_ * (fVar86 + fVar86);
        auVar13._24_4_ = auVar58._24_4_ * (fVar88 + fVar88);
        auVar13._28_4_ = auVar58._28_4_;
        auVar38._8_4_ = 0x40000000;
        auVar38._0_8_ = 0x4000000040000000;
        auVar38._12_4_ = 0x40000000;
        auVar38._16_4_ = 0x40000000;
        auVar38._20_4_ = 0x40000000;
        auVar38._24_4_ = 0x40000000;
        auVar38._28_4_ = 0x40000000;
        auVar116 = vsubps_avx(auVar38,auVar13);
        fVar59 = fVar27 + fVar27 + -1.0;
        fVar81 = fVar39 + fVar39 + -1.0;
        fVar82 = fVar40 + fVar40 + -1.0;
        fVar83 = fVar41 + fVar41 + -1.0;
        fVar85 = fVar84 + fVar84 + -1.0;
        fVar87 = fVar86 + fVar86 + -1.0;
        fVar89 = fVar88 + fVar88 + -1.0;
        in_ZMM2 = ZEXT3264(CONCAT428(auVar105._28_4_ + auVar105._28_4_ + -1.0,
                                     CONCAT424(fVar89,CONCAT420(fVar87,CONCAT416(fVar85,CONCAT412(
                                                  fVar83,CONCAT48(fVar82,CONCAT44(fVar81,fVar59)))))
                                              )));
        local_58 = auVar104._0_4_;
        fStack_54 = auVar104._4_4_;
        fStack_50 = auVar104._8_4_;
        fStack_4c = auVar104._12_4_;
        fStack_48 = auVar104._16_4_;
        fStack_44 = auVar104._20_4_;
        fStack_40 = auVar104._24_4_;
        auVar14._4_4_ = (fVar81 + fVar39 * auVar116._4_4_) * fStack_54;
        auVar14._0_4_ = (fVar59 + fVar27 * auVar116._0_4_) * local_58;
        auVar14._8_4_ = (fVar82 + fVar40 * auVar116._8_4_) * fStack_50;
        auVar14._12_4_ = (fVar83 + fVar41 * auVar116._12_4_) * fStack_4c;
        auVar14._16_4_ = (fVar85 + fVar84 * auVar116._16_4_) * fStack_48;
        auVar14._20_4_ = (fVar87 + fVar86 * auVar116._20_4_) * fStack_44;
        auVar14._24_4_ = (fVar89 + fVar88 * auVar116._24_4_) * fStack_40;
        auVar14._28_4_ = 0x40000000;
        *pauVar21 = auVar14;
        pauVar21 = pauVar21 + 1;
        lVar24 = lVar24 + 8;
      }
      for (; iVar23 + 3 < (int)uVar22; iVar23 = iVar23 + 4) {
        auVar64 = *(undefined1 (*) [16])*pauVar21;
        auVar110._8_4_ = 0x42b0c0a5;
        auVar110._0_8_ = 0x42b0c0a542b0c0a5;
        auVar110._12_4_ = 0x42b0c0a5;
        auVar123 = vminps_avx(auVar64,auVar110);
        auVar114._8_4_ = 0xc2b0c0a5;
        auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar114._12_4_ = 0xc2b0c0a5;
        auVar113 = vmaxps_avx(auVar114,auVar123);
        auVar117._8_4_ = 0x3f000000;
        auVar117._0_8_ = 0x3f0000003f000000;
        auVar117._12_4_ = 0x3f000000;
        auVar66._0_4_ = auVar113._0_4_ * 1.442695 + 0.5;
        auVar66._4_4_ = auVar113._4_4_ * 1.442695 + 0.5;
        auVar66._8_4_ = auVar113._8_4_ * 1.442695 + 0.5;
        auVar66._12_4_ = auVar113._12_4_ * 1.442695 + 0.5;
        auVar91._0_4_ = (int)auVar66._0_4_;
        auVar91._4_4_ = (int)auVar66._4_4_;
        auVar91._8_4_ = (int)auVar66._8_4_;
        auVar91._12_4_ = (int)auVar66._12_4_;
        auVar124 = vcvtdq2ps_avx(auVar91);
        auVar123 = vcmpps_avx(auVar66,auVar124,1);
        auVar108._8_4_ = 0x3f800000;
        auVar108._0_8_ = 0x3f8000003f800000;
        auVar108._12_4_ = 0x3f800000;
        auVar123 = vandps_avx(auVar123,auVar108);
        auVar123 = vsubps_avx(auVar124,auVar123);
        auVar92._0_4_ = auVar123._0_4_ * 0.6931472;
        auVar92._4_4_ = auVar123._4_4_ * 0.6931472;
        auVar92._8_4_ = auVar123._8_4_ * 0.6931472;
        auVar92._12_4_ = auVar123._12_4_ * 0.6931472;
        auVar124 = vsubps_avx(auVar113,auVar92);
        fVar27 = auVar124._0_4_;
        fVar39 = auVar124._4_4_;
        fVar40 = auVar124._8_4_;
        fVar41 = auVar124._12_4_;
        auVar67._0_4_ = (int)auVar123._0_4_;
        auVar67._4_4_ = (int)auVar123._4_4_;
        auVar67._8_4_ = (int)auVar123._8_4_;
        auVar67._12_4_ = (int)auVar123._12_4_;
        auVar123 = vpslld_avx(auVar67,0x17);
        auVar123 = vpaddd_avx(auVar123,auVar108);
        auVar49._0_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar123._0_4_ + 1.0;
        auVar49._4_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar123._4_4_ + 1.0;
        auVar49._8_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar123._8_4_ + 1.0;
        auVar49._12_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar123._12_4_ + 1.0;
        auVar68._8_4_ = 0x800000;
        auVar68._0_8_ = 0x80000000800000;
        auVar68._12_4_ = 0x800000;
        auVar123 = vmaxps_avx(auVar49,auVar68);
        auVar124 = vpsrld_avx(auVar123,0x17);
        auVar100._8_4_ = 0xffffff82;
        auVar100._0_8_ = 0xffffff82ffffff82;
        auVar100._12_4_ = 0xffffff82;
        auVar124 = vpaddd_avx(auVar124,auVar100);
        auVar101._8_4_ = 0x807fffff;
        auVar101._0_8_ = 0x807fffff807fffff;
        auVar101._12_4_ = 0x807fffff;
        auVar123 = vandps_avx(auVar123,auVar101);
        auVar33 = vorps_avx(auVar117,auVar123);
        auVar113 = vcvtdq2ps_avx(auVar124);
        auVar102._8_4_ = 0x3f3504f3;
        auVar102._0_8_ = 0x3f3504f33f3504f3;
        auVar102._12_4_ = 0x3f3504f3;
        auVar124 = vcmpps_avx(auVar33,auVar102,1);
        auVar123 = vandps_avx(auVar124,auVar33);
        fVar27 = auVar33._0_4_ + -1.0 + auVar123._0_4_;
        fVar39 = auVar33._4_4_ + -1.0 + auVar123._4_4_;
        fVar40 = auVar33._8_4_ + -1.0 + auVar123._8_4_;
        fVar41 = auVar33._12_4_ + -1.0 + auVar123._12_4_;
        auVar123 = vandps_avx(auVar124,auVar108);
        auVar124 = vsubps_avx(auVar113,auVar123);
        auVar123 = vcmpps_avx(auVar49,_DAT_004bf890,2);
        auVar69._0_4_ =
             (auVar124._0_4_ * 0.6931472 + fVar27 +
             fVar27 * fVar27 *
             (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                   -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 + 0.20000714
                ) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5)) * -2.0;
        auVar69._4_4_ =
             (auVar124._4_4_ * 0.6931472 + fVar39 +
             fVar39 * fVar39 *
             (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                   -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 + 0.20000714
                ) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5)) * -2.0;
        auVar69._8_4_ =
             (auVar124._8_4_ * 0.6931472 + fVar40 +
             fVar40 * fVar40 *
             (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                   -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 + 0.20000714
                ) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5)) * -2.0;
        auVar69._12_4_ =
             (auVar124._12_4_ * 0.6931472 + fVar41 +
             fVar41 * fVar41 *
             (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                   -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714
                ) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5)) * -2.0;
        auVar93._8_4_ = 0x7fffffff;
        auVar93._0_8_ = 0x7fffffff7fffffff;
        auVar93._12_4_ = 0x7fffffff;
        auVar123 = vblendvps_avx(auVar69,auVar93,auVar123);
        auVar70._8_4_ = 0x42b0c0a5;
        auVar70._0_8_ = 0x42b0c0a542b0c0a5;
        auVar70._12_4_ = 0x42b0c0a5;
        auVar123 = vminps_avx(auVar123,auVar70);
        auVar71._8_4_ = 0xc2b0c0a5;
        auVar71._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar71._12_4_ = 0xc2b0c0a5;
        auVar113 = vmaxps_avx(auVar123,auVar71);
        auVar72._0_4_ = auVar113._0_4_ * 1.442695 + 0.5;
        auVar72._4_4_ = auVar113._4_4_ * 1.442695 + 0.5;
        auVar72._8_4_ = auVar113._8_4_ * 1.442695 + 0.5;
        auVar72._12_4_ = auVar113._12_4_ * 1.442695 + 0.5;
        auVar94._0_4_ = (int)auVar72._0_4_;
        auVar94._4_4_ = (int)auVar72._4_4_;
        auVar94._8_4_ = (int)auVar72._8_4_;
        auVar94._12_4_ = (int)auVar72._12_4_;
        auVar124 = vcvtdq2ps_avx(auVar94);
        auVar123 = vcmpps_avx(auVar72,auVar124,1);
        auVar123 = vandps_avx(auVar123,auVar108);
        auVar123 = vsubps_avx(auVar124,auVar123);
        auVar95._0_4_ = auVar123._0_4_ * 0.6931472;
        auVar95._4_4_ = auVar123._4_4_ * 0.6931472;
        auVar95._8_4_ = auVar123._8_4_ * 0.6931472;
        auVar95._12_4_ = auVar123._12_4_ * 0.6931472;
        auVar124 = vsubps_avx(auVar113,auVar95);
        fVar27 = auVar124._0_4_;
        fVar39 = auVar124._4_4_;
        fVar40 = auVar124._8_4_;
        fVar41 = auVar124._12_4_;
        auVar73._0_4_ = (int)auVar123._0_4_;
        auVar73._4_4_ = (int)auVar123._4_4_;
        auVar73._8_4_ = (int)auVar123._8_4_;
        auVar73._12_4_ = (int)auVar123._12_4_;
        auVar123 = vpslld_avx(auVar73,0x17);
        auVar123 = vpaddd_avx(auVar123,auVar108);
        auVar50._0_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar123._0_4_ + 1.0;
        auVar50._4_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar123._4_4_ + 1.0;
        auVar50._8_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar123._8_4_ + 1.0;
        auVar50._12_4_ =
             (fVar41 + 1.0 +
             fVar41 * fVar41 *
             (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
               0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar123._12_4_ + 1.0;
        auVar123 = vrcpps_avx(auVar50);
        fVar27 = auVar123._0_4_;
        fVar39 = auVar123._4_4_;
        fVar40 = auVar123._8_4_;
        fVar41 = auVar123._12_4_;
        auVar51._0_4_ = auVar50._0_4_ * (fVar27 + fVar27);
        auVar51._4_4_ = auVar50._4_4_ * (fVar39 + fVar39);
        auVar51._8_4_ = auVar50._8_4_ * (fVar40 + fVar40);
        auVar51._12_4_ = auVar50._12_4_ * (fVar41 + fVar41);
        auVar103._8_4_ = 0x40000000;
        auVar103._0_8_ = 0x4000000040000000;
        auVar103._12_4_ = 0x40000000;
        auVar123 = vsubps_avx(auVar103,auVar51);
        fVar84 = fVar27 + fVar27 + -1.0;
        fVar86 = fVar39 + fVar39 + -1.0;
        fVar88 = fVar40 + fVar40 + -1.0;
        fVar59 = fVar41 + fVar41 + -1.0;
        in_ZMM2 = ZEXT1664(CONCAT412(fVar59,CONCAT48(fVar88,CONCAT44(fVar86,fVar84))));
        auVar34._0_4_ = (fVar84 + fVar27 * auVar123._0_4_) * auVar64._0_4_;
        auVar34._4_4_ = (fVar86 + fVar39 * auVar123._4_4_) * auVar64._4_4_;
        auVar34._8_4_ = (fVar88 + fVar40 * auVar123._8_4_) * auVar64._8_4_;
        auVar34._12_4_ = (fVar59 + fVar41 * auVar123._12_4_) * auVar64._12_4_;
        *(undefined1 (*) [16])*pauVar21 = auVar34;
        pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
        lVar24 = lVar24 + 4;
      }
      lVar17 = sVar4 * sVar3 * uVar15;
      for (; (int)lVar24 < (int)uVar22; lVar24 = lVar24 + 1) {
        fVar27 = *(float *)((long)pvVar2 + lVar24 * 4 + lVar17);
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        fVar39 = expf(fVar27);
        fVar39 = logf(fVar39 + 1.0);
        fVar39 = tanhf(fVar39);
        *(float *)((long)pvVar2 + lVar24 * 4 + lVar17) = fVar39 * fVar27;
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}